

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>_>
::MapSorterPtr(MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>_>
               *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
                     *m)

{
  void **ppvVar1;
  ulong uVar2;
  const_iterator __begin0;
  UntypedMapIterator local_38;
  
  uVar2 = (ulong)(m->
                 super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_UntypedMapBase.num_elements_;
  this->size_ = uVar2;
  if (uVar2 == 0) {
    (this->items_)._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>.
    _M_t.super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
    super__Head_base<0UL,_const_void_**,_false>._M_head_impl = (void **)0x0;
  }
  else {
    ppvVar1 = (void **)operator_new__(uVar2 << 3);
    (this->items_)._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>.
    _M_t.super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
    super__Head_base<0UL,_const_void_**,_false>._M_head_impl = ppvVar1;
    UntypedMapBase::begin(&local_38,(UntypedMapBase *)m);
    while (local_38.node_ != (NodeBase *)0x0) {
      *ppvVar1 = local_38.node_ + 1;
      ppvVar1 = ppvVar1 + 1;
      UntypedMapIterator::PlusPlus(&local_38);
    }
    ppvVar1 = (this->items_)._M_t.
              super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
              super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
              super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
    std::
    __sort<void_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterPtrLessThan<std::__cxx11::string>>>
              (ppvVar1,ppvVar1 + this->size_);
  }
  return;
}

Assistant:

explicit MapSorterPtr(const MapT& m)
      : size_(m.size()), items_(size_ ? new storage_type[size_] : nullptr) {
    if (!size_) return;
    storage_type* it = &items_[0];
    for (const auto& entry : m) {
      *it++ = &entry;
    }
    static_assert(PROTOBUF_FIELD_OFFSET(typename MapT::value_type, first) == 0,
                  "Must hold for MapSorterPtrLessThan to work.");
    std::sort(&items_[0], &items_[size_],
              MapSorterPtrLessThan<typename MapT::key_type>{});
  }